

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_time.cpp
# Opt level: O2

void __thiscall booster::locale::date_time::date_time(date_time *this,date_time *other)

{
  abstract_calendar *paVar1;
  int iVar2;
  undefined4 extraout_var;
  
  (this->impl_).ptr_ = (abstract_calendar *)0x0;
  iVar2 = (**((other->impl_).ptr_)->_vptr_abstract_calendar)();
  paVar1 = (this->impl_).ptr_;
  if (paVar1 != (abstract_calendar *)0x0) {
    (*paVar1->_vptr_abstract_calendar[0xe])();
  }
  (this->impl_).ptr_ = (abstract_calendar *)CONCAT44(extraout_var,iVar2);
  return;
}

Assistant:

date_time::date_time(date_time const &other)
{
    impl_.reset(other.impl_->clone());
}